

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_assert.cpp
# Opt level: O1

void lzham_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  char buf [512];
  char acStack_208 [512];
  
  sprintf_s(acStack_208,0x200,"%s(%u): Assertion failed: \"%s\"\n",pFile,(ulong)line,pExp);
  lzham_output_debug_string(acStack_208);
  printf("%s",acStack_208);
  bVar1 = lzham_is_debugger_present();
  if (bVar1) {
    lzham_debug_break();
  }
  return;
}

Assistant:

void lzham_assert(const char* pExp, const char* pFile, unsigned line)
{
   char buf[512];

   sprintf_s(buf, sizeof(buf), "%s(%u): Assertion failed: \"%s\"\n", pFile, line, pExp);

   lzham_output_debug_string(buf);

   printf("%s", buf);

   if (lzham_is_debugger_present())
      lzham_debug_break();
}